

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O2

void ssh2_transport_reconfigure(PacketProtocolLayer *ppl,Conf *conf)

{
  PktInQueue *pPVar1;
  PktInQueue *pPVar2;
  Ssh *pSVar3;
  long *plVar4;
  _Bool _Var5;
  _Bool _Var6;
  _Bool _Var7;
  uint uVar8;
  int iVar9;
  int iVar10;
  unsigned_long diff_1;
  Interactor *pIVar11;
  uint uVar12;
  char *pcVar13;
  bool bVar14;
  unsigned_long diff;
  unsigned_long size_consumed;
  char *pcVar15;
  int secondary;
  PacketProtocolLayerVtable *pPVar16;
  
  if (ppl->vt == &ssh2_transport_vtable) {
    uVar8 = conf_get_int(conf,0x1b);
    uVar12 = 0x3c;
    if (uVar8 < 0x8bd0) {
      uVar12 = uVar8;
    }
    _Var5 = ssh2_transport_timer_update
                      ((ssh2_transport_state *)&ppl[-0xd].ic_process_queue,(long)(int)uVar12);
    pPVar16 = (PacketProtocolLayerVtable *)0x0;
    pcVar15 = "timeout shortened";
    if (!_Var5) {
      pcVar15 = (char *)pPVar16;
    }
    pPVar1 = ppl[-0xb].in_pq;
    ssh2_transport_set_max_data_size((ssh2_transport_state *)&ppl[-0xd].ic_process_queue);
    pPVar2 = ppl[-0xb].in_pq;
    size_consumed = (long)pPVar1 - (long)pPVar2;
    if (pPVar2 != (PktInQueue *)0x0 && size_consumed != 0) {
      pSVar3 = ppl[-10].ssh;
      if (pPVar2 < pPVar1) {
        dts_consume((DataTransferStatsDirection *)&pSVar3->conf,size_consumed);
        dts_consume((DataTransferStatsDirection *)ppl[-10].ssh,size_consumed);
        if ((*(char *)((long)&(ppl[-10].ssh)->conf + 1) != '\0') ||
           (*(char *)((long)&(ppl[-10].ssh)->s + 1) == '\x01')) {
          pcVar15 = "data limit lowered";
        }
      }
      else {
        if (*(char *)&pSVar3->conf == '\x01') {
          (pSVar3->version_receiver).got_ssh_version =
               (pSVar3->version_receiver).got_ssh_version + ((long)pPVar2 - (long)pPVar1);
        }
        if (*(char *)&pSVar3->s == '\x01') {
          pSVar3->seat = (Seat *)((long)pSVar3->seat + ((long)pPVar2 - (long)pPVar1));
        }
      }
    }
    _Var5 = conf_get_bool((Conf *)ppl[-0xc].interactor,0x17);
    _Var6 = conf_get_bool(conf,0x17);
    bVar14 = _Var6 != _Var5;
    pcVar13 = "compression setting changed";
    if (!bVar14) {
      pcVar13 = pcVar15;
    }
    while( true ) {
      secondary = (int)pPVar16;
      if (secondary == 7) break;
      iVar9 = conf_get_int_int((Conf *)ppl[-0xc].interactor,0x20,secondary);
      iVar10 = conf_get_int_int(conf,0x20,secondary);
      if (iVar9 != iVar10) {
        pcVar13 = "cipher settings changed";
      }
      bVar14 = (bool)(bVar14 | iVar9 != iVar10);
      pPVar16 = (PacketProtocolLayerVtable *)(ulong)(secondary + 1);
    }
    _Var5 = conf_get_bool((Conf *)ppl[-0xc].interactor,0x24);
    _Var6 = conf_get_bool(conf,0x24);
    if (_Var6 != _Var5) {
      pcVar13 = "cipher settings changed";
    }
    conf_free((Conf *)ppl[-0xc].interactor);
    pIVar11 = (Interactor *)conf_copy(conf);
    ppl[-0xc].interactor = pIVar11;
    if ((PacketProtocolLayerVtable *)pcVar13 != (PacketProtocolLayerVtable *)0x0) {
      if ((*(char *)&ppl[-9].in_pq != '\0') || (_Var7 = ssh2_bpp_rekey_inadvisable(ppl->bpp), _Var7)
         ) {
        if ((bool)(_Var6 != _Var5 | bVar14)) {
          ppl[-9].ic_process_queue.ctx = pcVar13;
        }
      }
      else {
        ppl[-0xb].vt = (PacketProtocolLayerVtable *)pcVar13;
        *(undefined4 *)&ppl[-0xb].bpp = 3;
        queue_idempotent_callback(&ppl->ic_process_queue);
      }
    }
    plVar4 = (long *)ppl[-0xd].ic_process_queue.ctx;
    (**(code **)(*plVar4 + 0x20))(plVar4,conf);
    return;
  }
  __assert_fail("ppl->vt == &ssh2_transport_vtable",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/transport2.c"
                ,0x86e,"void ssh2_transport_reconfigure(PacketProtocolLayer *, Conf *)");
}

Assistant:

static void ssh2_transport_reconfigure(PacketProtocolLayer *ppl, Conf *conf)
{
    struct ssh2_transport_state *s;
    const char *rekey_reason = NULL;
    bool rekey_mandatory = false;
    unsigned long old_max_data_size, rekey_time;
    int i;

    assert(ppl->vt == &ssh2_transport_vtable);
    s = container_of(ppl, struct ssh2_transport_state, ppl);

    rekey_time = sanitise_rekey_time(
        conf_get_int(conf, CONF_ssh_rekey_time), 60);
    if (ssh2_transport_timer_update(s, rekey_time))
        rekey_reason = "timeout shortened";

    old_max_data_size = s->max_data_size;
    ssh2_transport_set_max_data_size(s);
    if (old_max_data_size != s->max_data_size &&
        s->max_data_size != 0) {
        if (s->max_data_size < old_max_data_size) {
            unsigned long diff = old_max_data_size - s->max_data_size;

            dts_consume(&s->stats->out, diff);
            dts_consume(&s->stats->in, diff);
            if (s->stats->out.expired || s->stats->in.expired)
                rekey_reason = "data limit lowered";
        } else {
            unsigned long diff = s->max_data_size - old_max_data_size;
            if (s->stats->out.running)
                s->stats->out.remaining += diff;
            if (s->stats->in.running)
                s->stats->in.remaining += diff;
        }
    }

    if (conf_get_bool(s->conf, CONF_compression) !=
        conf_get_bool(conf, CONF_compression)) {
        rekey_reason = "compression setting changed";
        rekey_mandatory = true;
    }

    for (i = 0; i < CIPHER_MAX; i++)
        if (conf_get_int_int(s->conf, CONF_ssh_cipherlist, i) !=
            conf_get_int_int(conf, CONF_ssh_cipherlist, i)) {
        rekey_reason = "cipher settings changed";
        rekey_mandatory = true;
    }
    if (conf_get_bool(s->conf, CONF_ssh2_des_cbc) !=
        conf_get_bool(conf, CONF_ssh2_des_cbc)) {
        rekey_reason = "cipher settings changed";
        rekey_mandatory = true;
    }

    conf_free(s->conf);
    s->conf = conf_copy(conf);

    if (rekey_reason) {
        if (!s->kex_in_progress && !ssh2_bpp_rekey_inadvisable(s->ppl.bpp)) {
            s->rekey_reason = rekey_reason;
            s->rekey_class = RK_NORMAL;
            queue_idempotent_callback(&s->ppl.ic_process_queue);
        } else if (rekey_mandatory) {
            s->deferred_rekey_reason = rekey_reason;
        }
    }

    /* Also pass the configuration along to our higher layer */
    ssh_ppl_reconfigure(s->higher_layer, conf);
}